

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  int *piVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  ImGuiContext *ctx;
  long lVar8;
  long lVar9;
  
  pIVar3 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  iVar7 = (pIVar3->SettingsIniData).Buf.Capacity;
  if (iVar7 < 0) {
    iVar7 = iVar7 / 2 + iVar7;
    iVar4 = 0;
    if (0 < iVar7) {
      iVar4 = iVar7;
    }
    if (pIVar3 != (ImGuiContext *)0x0) {
      piVar1 = &(pIVar3->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pcVar5 = (char *)(*GImAllocatorAllocFunc)((size_t)iVar4,GImAllocatorUserData);
    pcVar6 = (pIVar3->SettingsIniData).Buf.Data;
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar5,pcVar6,(long)(pIVar3->SettingsIniData).Buf.Size);
      pcVar6 = (pIVar3->SettingsIniData).Buf.Data;
      if ((pcVar6 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar6,GImAllocatorUserData);
    }
    (pIVar3->SettingsIniData).Buf.Data = pcVar5;
    (pIVar3->SettingsIniData).Buf.Capacity = iVar4;
  }
  (pIVar3->SettingsIniData).Buf.Size = 0;
  if ((pIVar3->SettingsIniData).Buf.Capacity == 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pcVar5 = (char *)(*GImAllocatorAllocFunc)(8,GImAllocatorUserData);
    pcVar6 = (pIVar3->SettingsIniData).Buf.Data;
    if (pcVar6 != (char *)0x0) {
      memcpy(pcVar5,pcVar6,(long)(pIVar3->SettingsIniData).Buf.Size);
      pcVar6 = (pIVar3->SettingsIniData).Buf.Data;
      if ((pcVar6 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar6,GImAllocatorUserData);
    }
    (pIVar3->SettingsIniData).Buf.Data = pcVar5;
    (pIVar3->SettingsIniData).Buf.Capacity = 8;
  }
  (pIVar3->SettingsIniData).Buf.Data[(pIVar3->SettingsIniData).Buf.Size] = '\0';
  (pIVar3->SettingsIniData).Buf.Size = (pIVar3->SettingsIniData).Buf.Size + 1;
  if (0 < (pIVar3->SettingsHandlers).Size) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      pIVar2 = (pIVar3->SettingsHandlers).Data;
      (**(code **)((long)&pIVar2->WriteAllFn + lVar8))
                (pIVar3,(long)&pIVar2->TypeName + lVar8,&pIVar3->SettingsIniData);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x48;
    } while (lVar9 < (pIVar3->SettingsHandlers).Size);
  }
  if (out_size != (size_t *)0x0) {
    iVar7 = (pIVar3->SettingsIniData).Buf.Size;
    iVar4 = iVar7 + -1;
    if (iVar7 == 0) {
      iVar4 = 0;
    }
    *out_size = (long)iVar4;
  }
  pcVar6 = (pIVar3->SettingsIniData).Buf.Data;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = ImGuiTextBuffer::EmptyString;
  }
  return pcVar6;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}